

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

float duckdb::TryCastCInternal<char*,float,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  undefined8 in_RAX;
  float fVar2;
  float result_value;
  float local_4;
  
  local_4 = (float)((ulong)in_RAX >> 0x20);
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,float>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_4);
  fVar2 = 0.0;
  if (bVar1) {
    fVar2 = local_4;
  }
  return fVar2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}